

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O3

int P_PushDown(AActor *thing,FChangePosition *cpos)

{
  double dVar1;
  AActor *thing_00;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  double dVar7;
  
  uVar2 = intersectors.Count;
  iVar4 = 1;
  if (thing->floorz < (thing->__Pos).Z) {
    iVar4 = thing->Mass;
    uVar6 = (ulong)intersectors.Count;
    P_FindBelowIntersectors(thing);
    if (uVar2 < intersectors.Count) {
      iVar5 = intersectors.Count - uVar2;
      do {
        thing_00 = intersectors.Array[uVar6];
        if (((thing_00->flags2).Value & 0x1000) == 0) {
          return 2;
        }
        if ((((thing_00->flags3).Value & 0x2000) == 0) && (iVar4 < thing_00->Mass)) {
          return 2;
        }
        if (((thing_00->flags4).Value & 0x80) != 0) {
          return 2;
        }
        dVar1 = (thing_00->__Pos).Z;
        P_AdjustFloorCeil(thing_00,cpos);
        dVar7 = (thing->__Pos).Z - thing_00->Height;
        if (dVar7 < dVar1) {
          (thing_00->__Pos).Z = dVar7;
          iVar3 = P_PushDown(thing_00,cpos);
          if (iVar3 != 0) {
            P_DoCrunch(thing_00,cpos);
            (thing_00->__Pos).Z = dVar1;
            return 2;
          }
          AActor::UpdateRenderSectorList(thing_00);
        }
        uVar6 = uVar6 + 1;
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
    }
    AActor::CheckPortalTransition(thing,true);
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int P_PushDown(AActor *thing, FChangePosition *cpos)
{
	unsigned int firstintersect = intersectors.Size();
	unsigned int lastintersect;
	int mymass = thing->Mass;

	if (thing->Z() <= thing->floorz)
	{
		return 1;
	}
	P_FindBelowIntersectors(thing);
	lastintersect = intersectors.Size();
	for (; firstintersect < lastintersect; firstintersect++)
	{
		AActor *intersect = intersectors[firstintersect];
		if (!(intersect->flags2 & MF2_PASSMOBJ) ||
			(!(intersect->flags3 & MF3_ISMONSTER) && intersect->Mass > mymass) ||
			(intersect->flags4 & MF4_ACTLIKEBRIDGE)
			)
		{
			// Can't push bridges or things more massive than ourself
			return 2;
		}
		double oldz = intersect->Z();
		P_AdjustFloorCeil(intersect, cpos);
		if (oldz > thing->Z() - intersect->Height)
		{ // Only push things down, not up.
			intersect->SetZ(thing->Z() - intersect->Height);
			if (P_PushDown(intersect, cpos))
			{ // Move blocked
				P_DoCrunch(intersect, cpos);
				intersect->SetZ(oldz);
				return 2;
			}
			intersect->UpdateRenderSectorList();
		}
	}
	thing->CheckPortalTransition(true);
	return 0;
}